

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O3

void pfd_receive(Plug *plug,int urgent,char *data,size_t len)

{
  BinarySink *pBVar1;
  char cVar2;
  _func_void_Plug_ptr_PlugCloseType_char_ptr *p_Var3;
  SshChannel *pSVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uint uVar8;
  char *s;
  unsigned_long uVar9;
  PlugVtable *pPVar10;
  ushort *puVar11;
  strbuf *psVar12;
  size_t sVar13;
  uint uVar14;
  uchar val;
  undefined4 uVar15;
  ptrlen pVar16;
  BinarySource src [1];
  
  if (len == 0) {
    return;
  }
  if (*(int *)((long)&plug[-5].vt + 4) != 0) {
    BinarySink_put_data((BinarySink *)&(plug[-2].vt)->sent,data,len);
    pPVar10 = plug[-2].vt;
    p_Var3 = pPVar10->closing;
    if (*(int *)((long)&plug[-5].vt + 4) == 1) {
      cVar2 = (char)*p_Var3;
      if (cVar2 == '\x04') {
        uVar15 = 2;
      }
      else {
        if (cVar2 != '\x05') {
LAB_001064e0:
          (**(code **)((plug[-6].vt)->log + 8))();
          free_portfwd_state((PortForwarding *)(plug + -8));
          return;
        }
        uVar15 = 3;
      }
      *(undefined4 *)((long)&plug[-5].vt + 4) = uVar15;
    }
    src[0].len = (size_t)pPVar10->receive;
    src[0].binarysource_ = src;
    src[0].pos = 0;
    src[0].err = BSE_NO_ERROR;
    src[0].data = p_Var3;
    BinarySource_get_data(src[0].binarysource_,(size_t)plug[-1].vt);
    uVar15 = *(undefined4 *)((long)&plug[-5].vt + 4);
switchD_00106060_default:
    switch(uVar15) {
    case 0:
      goto switchD_00106060_caseD_0;
    case 1:
      __assert_fail("false && \"These case values cannot appear\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/portfwd.c"
                    ,0xf5,"void pfd_receive(Plug *, int, const char *, size_t)");
    case 2:
      uVar5 = BinarySource_get_byte(src[0].binarysource_);
      uVar6 = BinarySource_get_byte(src[0].binarysource_);
      if ((src[0].binarysource_)->err == BSE_OUT_OF_DATA) {
        return;
      }
      if ((uVar5 == '\x04') && (uVar6 == '\x01')) {
        uVar8 = BinarySource_get_uint16(src[0].binarysource_);
        uVar9 = BinarySource_get_uint32(src[0].binarysource_);
        uVar14 = (uint)uVar9 - 1;
        BinarySource_get_asciz(src[0].binarysource_);
        if (uVar14 < 0xff) {
          s = BinarySource_get_asciz(src[0].binarysource_);
        }
        else {
          s = (char *)0x0;
        }
        if ((src[0].binarysource_)->err == BSE_NO_ERROR) {
          *(uint *)&plug[-3].vt = uVar8;
          if (uVar14 < 0xff) {
            pPVar10 = (PlugVtable *)dupstr(s);
          }
          else {
            pPVar10 = (PlugVtable *)
                      dupprintf("%u.%u.%u.%u",uVar9 >> 0x18 & 0xff,
                                (ulong)((uint)(uVar9 >> 0x10) & 0xff),
                                (ulong)((uint)(uVar9 >> 8) & 0xff),(ulong)((uint)uVar9 & 0xff));
          }
          plug[-4].vt = pPVar10;
          psVar12 = strbuf_new();
          pBVar1 = psVar12->binarysink_;
          uVar15 = 0;
          BinarySink_put_byte(pBVar1,'\0');
          BinarySink_put_byte(pBVar1,'Z');
          BinarySink_put_uint16(pBVar1,0);
          BinarySink_put_uint32(pBVar1,0);
          (**(code **)((plug[-6].vt)->log + 0x10))(plug[-6].vt,psVar12->u,psVar12->len);
          strbuf_free(psVar12);
          break;
        }
        if ((src[0].binarysource_)->err == BSE_OUT_OF_DATA) {
          return;
        }
      }
      psVar12 = strbuf_new();
      pBVar1 = psVar12->binarysink_;
      BinarySink_put_byte(pBVar1,'\0');
      BinarySink_put_byte(pBVar1,'[');
      BinarySink_put_uint16(pBVar1,0);
      BinarySink_put_uint32(pBVar1,0);
      (**(code **)((plug[-6].vt)->log + 0x10))(plug[-6].vt,psVar12->u,psVar12->len);
      strbuf_free(psVar12);
      goto LAB_001064e0;
    case 3:
      BinarySource_get_byte(src[0].binarysource_);
      pVar16 = BinarySource_get_pstring(src[0].binarysource_);
      uVar5 = 0xff;
      if (pVar16.len != 0) {
        sVar13 = 0;
        do {
          if (*(char *)((long)pVar16.ptr + sVar13) == '\0') {
            uVar5 = '\0';
            break;
          }
          sVar13 = sVar13 + 1;
        } while (pVar16.len != sVar13);
      }
      if ((src[0].binarysource_)->err != BSE_NO_ERROR) {
        if ((src[0].binarysource_)->err == BSE_OUT_OF_DATA) {
          return;
        }
        uVar5 = 0xff;
      }
      psVar12 = strbuf_new();
      BinarySink_put_byte(psVar12->binarysink_,'\x05');
      BinarySink_put_byte(psVar12->binarysink_,uVar5);
      (**(code **)((plug[-6].vt)->log + 0x10))(plug[-6].vt,psVar12->u,psVar12->len);
      strbuf_free(psVar12);
      uVar15 = 4;
      if (uVar5 == 0xff) goto LAB_001064e0;
      break;
    case 4:
      uVar5 = BinarySource_get_byte(src[0].binarysource_);
      uVar6 = BinarySource_get_byte(src[0].binarysource_);
      uVar7 = BinarySource_get_byte(src[0].binarysource_);
      val = '\a';
      if (((uVar5 == '\x05') && (uVar6 == '\x01')) && (uVar7 == '\0')) {
        uVar5 = BinarySource_get_byte(src[0].binarysource_);
        if (uVar5 == '\x04') {
          pVar16 = BinarySource_get_data(src[0].binarysource_,0x10);
          puVar11 = (ushort *)pVar16.ptr;
          if (pVar16.len != 0x10) {
            __assert_fail("ipv6.len == 16",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/portfwd.c"
                          ,0xb6,"char *ipv6_to_string(ptrlen)");
          }
          val = '\0';
          pPVar10 = (PlugVtable *)
                    dupprintf("%04x:%04x:%04x:%04x:%04x:%04x:%04x:%04x",
                              (ulong)(ushort)(*puVar11 << 8 | *puVar11 >> 8),
                              (ulong)(ushort)(puVar11[1] << 8 | puVar11[1] >> 8),
                              (ulong)(ushort)(puVar11[2] << 8 | puVar11[2] >> 8),
                              (ulong)(ushort)(puVar11[3] << 8 | puVar11[3] >> 8),
                              (ulong)(ushort)(puVar11[4] << 8 | puVar11[4] >> 8),
                              (ulong)(ushort)(puVar11[5] << 8 | puVar11[5] >> 8),
                              (ulong)(ushort)(puVar11[6] << 8 | puVar11[6] >> 8),
                              (ulong)(ushort)(puVar11[7] << 8 | puVar11[7] >> 8));
        }
        else if (uVar5 == '\x03') {
          pVar16 = BinarySource_get_pstring(src[0].binarysource_);
          pPVar10 = (PlugVtable *)mkstr(pVar16);
          val = '\0';
        }
        else if (uVar5 == '\x01') {
          uVar9 = BinarySource_get_uint32(src[0].binarysource_);
          val = '\0';
          pPVar10 = (PlugVtable *)
                    dupprintf("%u.%u.%u.%u",uVar9 >> 0x18 & 0xff,
                              (ulong)((uint)(uVar9 >> 0x10) & 0xff),
                              (ulong)((uint)(uVar9 >> 8) & 0xff),(ulong)((uint)uVar9 & 0xff));
        }
        else {
          val = '\b';
          pPVar10 = (PlugVtable *)0x0;
        }
        plug[-4].vt = pPVar10;
        uVar8 = BinarySource_get_uint16(src[0].binarysource_);
        *(uint *)&plug[-3].vt = uVar8;
      }
      if ((src[0].binarysource_)->err != BSE_NO_ERROR) {
        if ((src[0].binarysource_)->err == BSE_OUT_OF_DATA) {
          return;
        }
        val = '\x01';
      }
      psVar12 = strbuf_new();
      pBVar1 = psVar12->binarysink_;
      BinarySink_put_byte(pBVar1,'\x05');
      BinarySink_put_byte(pBVar1,val);
      uVar15 = 0;
      BinarySink_put_byte(pBVar1,'\0');
      BinarySink_put_byte(pBVar1,'\x01');
      BinarySink_put_uint32(pBVar1,0);
      BinarySink_put_uint16(pBVar1,0);
      (**(code **)((plug[-6].vt)->log + 0x10))(plug[-6].vt,psVar12->u,psVar12->len);
      strbuf_free(psVar12);
      if (val != '\0') goto LAB_001064e0;
      break;
    default:
      goto switchD_00106060_default;
    }
    *(undefined4 *)((long)&plug[-5].vt + 4) = uVar15;
    plug[-1].vt = (PlugVtable *)src[0].pos;
    goto switchD_00106060_default;
  }
LAB_00106474:
  if (*(char *)((long)&plug[-5].vt + 1) == '\x01') {
    pSVar4 = ((PortForwarding *)(plug + -8))->c;
    (*pSVar4->vt->write)(pSVar4,false,data,len);
  }
  return;
switchD_00106060_caseD_0:
  (**(code **)((plug[-6].vt)->log + 0x28))(plug[-6].vt,1);
  pPVar10 = (PlugVtable *)
            wrap_lportfwd_open((ConnectionLayer *)plug[-7].vt,(char *)plug[-4].vt,
                               *(int *)&plug[-3].vt,(Socket *)plug[-6].vt,(Channel *)(plug + 1));
  plug[-8].vt = pPVar10;
  goto LAB_00106474;
}

Assistant:

static void pfd_receive(Plug *plug, int urgent, const char *data, size_t len)
{
    struct PortForwarding *pf =
        container_of(plug, struct PortForwarding, plug);

    if (len == 0)
        return;

    if (pf->socks_state != SOCKS_NONE) {
        BinarySource src[1];

        /*
         * Store all the data we've got in socksbuf.
         */
        put_data(pf->socksbuf, data, len);

        /*
         * Check the start of socksbuf to see if it's a valid and
         * complete message in the SOCKS exchange.
         */

        if (pf->socks_state == SOCKS_INITIAL) {
            /* Preliminary: check the first byte of the data (which we
             * _must_ have by now) to find out which SOCKS major
             * version we're speaking. */
            switch (pf->socksbuf->u[0]) {
              case SOCKS4_REQUEST_VERSION:
                pf->socks_state = SOCKS_4;
                break;
              case SOCKS5_REQUEST_VERSION:
                pf->socks_state = SOCKS_5_INITIAL;
                break;
              default:
                pfd_close(pf);         /* unrecognised version */
                return;
            }
        }

        BinarySource_BARE_INIT(src, pf->socksbuf->u, pf->socksbuf->len);
        get_data(src, pf->socksbuf_consumed);

        while (pf->socks_state != SOCKS_NONE) {
            unsigned socks_version, message_type, reserved_byte;
            unsigned reply_code, port, ipv4, method;
            ptrlen methods;
            const char *socks4_hostname;
            strbuf *output;

            switch (pf->socks_state) {
              case SOCKS_INITIAL:
              case SOCKS_NONE:
                unreachable("These case values cannot appear");

              case SOCKS_4:
                /* SOCKS 4/4A connect message */
                socks_version = get_byte(src);
                message_type = get_byte(src);

                if (get_err(src) == BSE_OUT_OF_DATA)
                    return;
                if (socks_version == SOCKS4_REQUEST_VERSION &&
                    message_type == SOCKS_CMD_CONNECT) {
                    /* CONNECT message */
                    bool name_based = false;

                    port = get_uint16(src);
                    ipv4 = get_uint32(src);
                    if (ipv4 >= SOCKS4A_NAME_FOLLOWS_BASE &&
                        ipv4 < SOCKS4A_NAME_FOLLOWS_LIMIT) {
                        /*
                         * Addresses in this range indicate the SOCKS 4A
                         * extension to specify a hostname, which comes
                         * after the username.
                         */
                        name_based = true;
                    }
                    get_asciz(src);        /* skip username */
                    socks4_hostname = name_based ? get_asciz(src) : NULL;

                    if (get_err(src) == BSE_OUT_OF_DATA)
                        return;
                    if (get_err(src))
                        goto socks4_reject;

                    pf->port = port;
                    if (name_based) {
                        pf->hostname = dupstr(socks4_hostname);
                    } else {
                        pf->hostname = ipv4_to_string(ipv4);
                    }

                    output = strbuf_new();
                    put_byte(output, SOCKS4_REPLY_VERSION);
                    put_byte(output, SOCKS4_RESP_SUCCESS);
                    put_uint16(output, 0);     /* null port field */
                    put_uint32(output, 0);     /* null address field */
                    sk_write(pf->s, output->u, output->len);
                    strbuf_free(output);

                    pf->socks_state = SOCKS_NONE;
                    pf->socksbuf_consumed = src->pos;
                    break;
                }

              socks4_reject:
                output = strbuf_new();
                put_byte(output, SOCKS4_REPLY_VERSION);
                put_byte(output, SOCKS4_RESP_FAILURE);
                put_uint16(output, 0);     /* null port field */
                put_uint32(output, 0);     /* null address field */
                sk_write(pf->s, output->u, output->len);
                strbuf_free(output);
                pfd_close(pf);
                return;

              case SOCKS_5_INITIAL:
                /* SOCKS 5 initial method list */
                socks_version = get_byte(src);
                methods = get_pstring(src);

                method = SOCKS5_AUTH_REJECTED;

                /* Search the method list for AUTH_NONE, which is the
                 * only one this client code can speak */
                for (size_t i = 0; i < methods.len; i++) {
                    unsigned char this_method =
                        ((const unsigned char *)methods.ptr)[i];
                    if (this_method == SOCKS5_AUTH_NONE) {
                        method = this_method;
                        break;
                    }
                }

                if (get_err(src) == BSE_OUT_OF_DATA)
                    return;
                if (get_err(src))
                    method = SOCKS5_AUTH_REJECTED;

                output = strbuf_new();
                put_byte(output, SOCKS5_REPLY_VERSION);
                put_byte(output, method);
                sk_write(pf->s, output->u, output->len);
                strbuf_free(output);

                if (method == SOCKS5_AUTH_REJECTED) {
                    pfd_close(pf);
                    return;
                }

                pf->socks_state = SOCKS_5_CONNECT;
                pf->socksbuf_consumed = src->pos;
                break;

              case SOCKS_5_CONNECT:
                /* SOCKS 5 connect message */
                socks_version = get_byte(src);
                message_type = get_byte(src);
                reserved_byte = get_byte(src);

                if (socks_version == SOCKS5_REQUEST_VERSION &&
                    message_type == SOCKS_CMD_CONNECT &&
                    reserved_byte == 0) {

                    reply_code = SOCKS5_RESP_SUCCESS;

                    switch (get_byte(src)) {
                      case SOCKS5_ADDR_IPV4:
                        pf->hostname = ipv4_to_string(get_uint32(src));
                        break;
                      case SOCKS5_ADDR_IPV6:
                        pf->hostname = ipv6_to_string(get_data(src, 16));
                        break;
                      case SOCKS5_ADDR_HOSTNAME:
                        pf->hostname = mkstr(get_pstring(src));
                        break;
                      default:
                        pf->hostname = NULL;
                        reply_code = SOCKS5_RESP_ADDRTYPE_NOT_SUPPORTED;
                        break;
                    }

                    pf->port = get_uint16(src);
                } else {
                    reply_code = SOCKS5_RESP_COMMAND_NOT_SUPPORTED;
                }

                if (get_err(src) == BSE_OUT_OF_DATA)
                    return;
                if (get_err(src))
                    reply_code = SOCKS5_RESP_FAILURE;

                output = strbuf_new();
                put_byte(output, SOCKS5_REPLY_VERSION);
                put_byte(output, reply_code);
                put_byte(output, 0);       /* reserved */
                put_byte(output, SOCKS5_ADDR_IPV4); /* IPv4 address follows */
                put_uint32(output, 0);     /* bound IPv4 address (unused) */
                put_uint16(output, 0);     /* bound port number (unused) */
                sk_write(pf->s, output->u, output->len);
                strbuf_free(output);

                if (reply_code != SOCKS5_RESP_SUCCESS) {
                    pfd_close(pf);
                    return;
                }

                pf->socks_state = SOCKS_NONE;
                pf->socksbuf_consumed = src->pos;
                break;
            }
        }

        /*
         * We come here when we're ready to make an actual
         * connection.
         */

        /*
         * Freeze the socket until the SSH server confirms the
         * connection.
         */
        sk_set_frozen(pf->s, true);

        pf->c = wrap_lportfwd_open(pf->cl, pf->hostname, pf->port, pf->s,
                                   &pf->chan);
    }
    if (pf->ready)
        sshfwd_write(pf->c, data, len);
}